

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

XrResult ApiDumpLayerXrLocateViews
                   (XrSession session,XrViewLocateInfo *viewLocateInfo,XrViewState *viewState,
                   uint32_t viewCapacityInput,uint32_t *viewCountOutput,XrView *views)

{
  long lVar1;
  XrViewState *pXVar2;
  bool bVar3;
  XrResult XVar4;
  invalid_argument *this;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  __hash_code __code;
  _Hash_node_base *p_Var7;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  ostringstream oss_viewCapacityInput;
  ostringstream oss_views;
  ostringstream oss_viewCountOutput;
  ostringstream oss_viewState;
  ostringstream oss_session;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_838;
  XrGeneratedDispatchTable *local_818;
  XrViewLocateInfo *local_810;
  string local_808;
  XrViewState *local_7e8;
  string local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788 [3];
  ios_base local_718 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610 [3];
  ios_base local_5a0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498 [3];
  ios_base local_428 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [3];
  ios_base local_2b0 [264];
  unique_lock<std::mutex> local_1a8;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_838.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_838.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_838.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8._M_device = &g_session_dispatch_mutex;
  local_1a8._M_owns = false;
  local_810 = viewLocateInfo;
  std::unique_lock<std::mutex>::lock(&local_1a8);
  local_1a8._M_owns = true;
  p_Var5 = g_session_dispatch_map._M_h._M_buckets
           [(ulong)session % g_session_dispatch_map._M_h._M_bucket_count];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var7 = p_Var5->_M_nxt, p_Var6 = p_Var5, (XrSession)p_Var5->_M_nxt[1]._M_nxt != session)) {
    while (p_Var5 = p_Var7, p_Var7 = p_Var5->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var7[1]._M_nxt % g_session_dispatch_map._M_h._M_bucket_count !=
           (ulong)session % g_session_dispatch_map._M_h._M_bucket_count) ||
         (p_Var6 = p_Var5, (XrSession)p_Var7[1]._M_nxt == session)) goto LAB_00221a93;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_00221a93:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var7 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var7 = p_Var6->_M_nxt;
  }
  if (p_Var7 == (_Hash_node_base *)0x0) {
    local_818 = (XrGeneratedDispatchTable *)0x0;
  }
  else {
    local_818 = (XrGeneratedDispatchTable *)p_Var7[2]._M_nxt;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_1a8);
  if (p_Var7 == (_Hash_node_base *)0x0) {
    XVar4 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[14],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_838,(char (*) [9])"XrResult",(char (*) [14])"xrLocateViews",
               (char (*) [1])0x2a4b54);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    lVar1 = *(long *)((long)&local_1a8._M_device[-1].super___mutex_base._M_mutex + 0x10);
    *(uint *)((long)auStack_190 + lVar1) = *(uint *)((long)auStack_190 + lVar1) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&local_1a8);
    std::__cxx11::stringbuf::str();
    local_7e8 = viewState;
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[10],char_const(&)[8],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_838,(char (*) [10])"XrSession",(char (*) [8])"session",local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
      operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
    }
    local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_808,"viewLocateInfo","");
    local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_7e0,"const XrViewLocateInfo*","");
    bVar3 = ApiDumpOutputXrStruct(local_818,local_810,&local_808,&local_7e0,true,&local_838);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
      operator_delete(local_7e0._M_dataplus._M_p,local_7e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_808._M_dataplus._M_p != &local_808.field_2) {
      operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
    }
    if (!bVar3) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Invalid Operation");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    pXVar2 = local_7e8;
    *(uint *)((long)&local_320[0].field_2 + *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_320[0].field_2 +
                  *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(local_320);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[13],char_const(&)[10],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_838,(char (*) [13])0x2a9160,(char (*) [10])"viewState",local_788);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_788[0]._M_dataplus._M_p != &local_788[0].field_2) {
      operator_delete(local_788[0]._M_dataplus._M_p,local_788[0].field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_788);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_788,"0x",2);
    *(uint *)((long)&local_788[0].field_2 + *(long *)(local_788[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_788[0].field_2 +
                  *(long *)(local_788[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)local_788);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[18],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_838,(char (*) [9])"uint32_t",(char (*) [18])"viewCapacityInput",local_498);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
      operator_delete(local_498[0]._M_dataplus._M_p,local_498[0].field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
    *(uint *)((long)&local_498[0].field_2 + *(long *)(local_498[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_498[0].field_2 +
                  *(long *)(local_498[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(local_498);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[10],char_const(&)[16],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_838,(char (*) [10])0x2a72f0,(char (*) [16])"viewCountOutput",local_610);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610[0]._M_dataplus._M_p != &local_610[0].field_2) {
      operator_delete(local_610[0]._M_dataplus._M_p,local_610[0].field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
    *(uint *)((long)&local_610[0].field_2 + *(long *)(local_610[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_610[0].field_2 +
                  *(long *)(local_610[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(local_610);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[8],char_const(&)[6],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_838,(char (*) [8])0x2a9100,(char (*) [6])"views",&local_7c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
      operator_delete(local_7c0._M_dataplus._M_p,local_7c0.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_7a0,&local_838);
    ApiDumpLayerRecordContent(&local_7a0);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_7a0);
    XVar4 = (*local_818->LocateViews)
                      (session,local_810,pXVar2,viewCapacityInput,viewCountOutput,views);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_610);
    std::ios_base::~ios_base(local_5a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
    std::ios_base::~ios_base(local_428);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_788);
    std::ios_base::~ios_base(local_718);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_838);
  return XVar4;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrLocateViews(
    XrSession session,
    const XrViewLocateInfo* viewLocateInfo,
    XrViewState* viewState,
    uint32_t viewCapacityInput,
    uint32_t* viewCountOutput,
    XrView* views) {
    XrResult result = XR_SUCCESS;
    try {
        // Generate output for this command
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        XrGeneratedDispatchTable *gen_dispatch_table = nullptr;

        {
            std::unique_lock<std::mutex> mlock(g_session_dispatch_mutex);
            auto map_iter = g_session_dispatch_map.find(session);
            if (map_iter == g_session_dispatch_map.end()) {
                return XR_ERROR_VALIDATION_FAILURE;
            }
            gen_dispatch_table = map_iter->second;
        }

        contents.emplace_back("XrResult", "xrLocateViews", "");
        std::ostringstream oss_session;
        oss_session << std::hex << reinterpret_cast<const void*>(session);
        contents.emplace_back("XrSession", "session", oss_session.str());
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, viewLocateInfo, "viewLocateInfo", "const XrViewLocateInfo*", true, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::ostringstream oss_viewState;
        oss_viewState << std::hex << reinterpret_cast<const void*>(viewState);
        contents.emplace_back("XrViewState*", "viewState", oss_viewState.str());
        std::ostringstream oss_viewCapacityInput;
        oss_viewCapacityInput << "0x" << std::hex << (viewCapacityInput);
        contents.emplace_back("uint32_t", "viewCapacityInput", oss_viewCapacityInput.str());
        std::ostringstream oss_viewCountOutput;
        oss_viewCountOutput << std::hex << (viewCountOutput);
        contents.emplace_back("uint32_t*", "viewCountOutput", oss_viewCountOutput.str());
        std::ostringstream oss_views;
        oss_views << std::hex << reinterpret_cast<const void*>(views);
        contents.emplace_back("XrView*", "views", oss_views.str());
        ApiDumpLayerRecordContent(contents);

        result = gen_dispatch_table->LocateViews(session, viewLocateInfo, viewState, viewCapacityInput, viewCountOutput, views);
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}